

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# city.cc
# Opt level: O0

uint32 CityHash32(char *s,size_t len)

{
  uint32 uVar1;
  uint32 uVar2;
  uint32 uVar3;
  uint32 uVar4;
  uint32 uVar5;
  uint32 uVar6;
  __uint32_t _Var7;
  uint32 local_64;
  uint32 local_60;
  uint32 a4_1;
  uint32 a3_1;
  uint32 a2_1;
  uint32 a1_1;
  uint32 a0_1;
  size_t iters;
  uint32 a4;
  uint32 a3;
  uint32 a2;
  uint32 a1;
  uint32 a0;
  uint32 f;
  uint32 g;
  uint32 h;
  size_t len_local;
  char *s_local;
  
  _g = len;
  len_local = (size_t)s;
  if (len < 0x19) {
    if (len < 0xd) {
      if (len < 5) {
        local_60 = Hash32Len0to4(s,len);
      }
      else {
        local_60 = Hash32Len5to12(s,len);
      }
      local_64 = local_60;
    }
    else {
      local_64 = Hash32Len13to24(s,len);
    }
    s_local._4_4_ = local_64;
  }
  else {
    f = (uint32)len;
    a1 = f * -0x3361d2af;
    a0 = a1;
    uVar1 = Fetch32(s + (len - 4));
    uVar1 = Rotate32(uVar1 * -0x3361d2af,0x11);
    uVar2 = Fetch32((char *)(len_local + _g + -8));
    uVar2 = Rotate32(uVar2 * -0x3361d2af,0x11);
    uVar3 = Fetch32((char *)(len_local + _g + -0x10));
    uVar3 = Rotate32(uVar3 * -0x3361d2af,0x11);
    uVar4 = Fetch32((char *)(len_local + _g + -0xc));
    uVar4 = Rotate32(uVar4 * -0x3361d2af,0x11);
    uVar5 = Fetch32((char *)(len_local + _g + -0x14));
    uVar5 = Rotate32(uVar5 * -0x3361d2af,0x11);
    f = uVar1 * 0x1b873593 ^ f;
    uVar1 = Rotate32(f,0x13);
    f = uVar3 * 0x1b873593 ^ uVar1 * 5 + 0xe6546b64;
    uVar1 = Rotate32(f,0x13);
    f = uVar1 * 5 + 0xe6546b64;
    a0 = uVar2 * 0x1b873593 ^ a0;
    uVar1 = Rotate32(a0,0x13);
    a0 = uVar4 * 0x1b873593 ^ uVar1 * 5 + 0xe6546b64;
    uVar1 = Rotate32(a0,0x13);
    a0 = uVar1 * 5 + 0xe6546b64;
    a1 = uVar5 * 0x1b873593 + a1;
    uVar1 = Rotate32(a1,0x13);
    a1 = uVar1 * 5 + 0xe6546b64;
    _a1_1 = (_g - 1) / 0x14;
    do {
      uVar1 = Fetch32((char *)len_local);
      uVar1 = Rotate32(uVar1 * -0x3361d2af,0x11);
      uVar2 = Fetch32((char *)(len_local + 4));
      uVar3 = Fetch32((char *)(len_local + 8));
      uVar3 = Rotate32(uVar3 * -0x3361d2af,0x11);
      uVar4 = Fetch32((char *)(len_local + 0xc));
      uVar4 = Rotate32(uVar4 * -0x3361d2af,0x11);
      uVar5 = Fetch32((char *)(len_local + 0x10));
      f = uVar1 * 0x1b873593 ^ f;
      uVar6 = Rotate32(f,0x12);
      f = uVar6 * 5 + 0xe6546b64;
      a1 = uVar2 + a1;
      uVar6 = Rotate32(a1,0x13);
      a1 = uVar6 * -0x3361d2af;
      a0 = uVar3 * 0x1b873593 + a0;
      uVar3 = Rotate32(a0,0x12);
      a0 = uVar3 * 5 + 0xe6546b64;
      f = uVar4 * 0x1b873593 + uVar2 ^ f;
      uVar2 = Rotate32(f,0x13);
      f = uVar2 * 5 + 0xe6546b64;
      a0 = uVar5 ^ a0;
      _Var7 = __bswap_32(a0);
      a0 = _Var7 * 5;
      f = uVar5 * 5 + f;
      f = __bswap_32(f);
      a1 = uVar1 * 0x1b873593 + a1;
      std::swap<unsigned_int>(&a1,&f);
      std::swap<unsigned_int>(&a1,&a0);
      len_local = len_local + 0x14;
      _a1_1 = _a1_1 - 1;
    } while (_a1_1 != 0);
    uVar1 = Rotate32(a0,0xb);
    a0 = uVar1 * -0x3361d2af;
    uVar1 = Rotate32(a0,0x11);
    a0 = uVar1 * -0x3361d2af;
    uVar1 = Rotate32(a1,0xb);
    a1 = uVar1 * -0x3361d2af;
    uVar1 = Rotate32(a1,0x11);
    a1 = uVar1 * -0x3361d2af;
    uVar1 = Rotate32(f + a0,0x13);
    f = uVar1 * 5 + 0xe6546b64;
    uVar1 = Rotate32(f,0x11);
    f = uVar1 * -0x3361d2af;
    uVar1 = Rotate32(f + a1,0x13);
    f = uVar1 * 5 + 0xe6546b64;
    uVar1 = Rotate32(f,0x11);
    s_local._4_4_ = uVar1 * -0x3361d2af;
  }
  return s_local._4_4_;
}

Assistant:

uint32 CityHash32(const char *s, size_t len) {
  if (len <= 24) {
    return len <= 12 ?
        (len <= 4 ? Hash32Len0to4(s, len) : Hash32Len5to12(s, len)) :
        Hash32Len13to24(s, len);
  }

  // len > 24
  uint32 h = len, g = c1 * len, f = g;
  uint32 a0 = Rotate32(Fetch32(s + len - 4) * c1, 17) * c2;
  uint32 a1 = Rotate32(Fetch32(s + len - 8) * c1, 17) * c2;
  uint32 a2 = Rotate32(Fetch32(s + len - 16) * c1, 17) * c2;
  uint32 a3 = Rotate32(Fetch32(s + len - 12) * c1, 17) * c2;
  uint32 a4 = Rotate32(Fetch32(s + len - 20) * c1, 17) * c2;
  h ^= a0;
  h = Rotate32(h, 19);
  h = h * 5 + 0xe6546b64;
  h ^= a2;
  h = Rotate32(h, 19);
  h = h * 5 + 0xe6546b64;
  g ^= a1;
  g = Rotate32(g, 19);
  g = g * 5 + 0xe6546b64;
  g ^= a3;
  g = Rotate32(g, 19);
  g = g * 5 + 0xe6546b64;
  f += a4;
  f = Rotate32(f, 19);
  f = f * 5 + 0xe6546b64;
  size_t iters = (len - 1) / 20;
  do {
    uint32 a0 = Rotate32(Fetch32(s) * c1, 17) * c2;
    uint32 a1 = Fetch32(s + 4);
    uint32 a2 = Rotate32(Fetch32(s + 8) * c1, 17) * c2;
    uint32 a3 = Rotate32(Fetch32(s + 12) * c1, 17) * c2;
    uint32 a4 = Fetch32(s + 16);
    h ^= a0;
    h = Rotate32(h, 18);
    h = h * 5 + 0xe6546b64;
    f += a1;
    f = Rotate32(f, 19);
    f = f * c1;
    g += a2;
    g = Rotate32(g, 18);
    g = g * 5 + 0xe6546b64;
    h ^= a3 + a1;
    h = Rotate32(h, 19);
    h = h * 5 + 0xe6546b64;
    g ^= a4;
    g = bswap_32(g) * 5;
    h += a4 * 5;
    h = bswap_32(h);
    f += a0;
    PERMUTE3(f, h, g);
    s += 20;
  } while (--iters != 0);
  g = Rotate32(g, 11) * c1;
  g = Rotate32(g, 17) * c1;
  f = Rotate32(f, 11) * c1;
  f = Rotate32(f, 17) * c1;
  h = Rotate32(h + g, 19);
  h = h * 5 + 0xe6546b64;
  h = Rotate32(h, 17) * c1;
  h = Rotate32(h + f, 19);
  h = h * 5 + 0xe6546b64;
  h = Rotate32(h, 17) * c1;
  return h;
}